

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

CharCount UnifiedRegex::MatchCharNode::FindUniqueEquivs(Char *equivs,Char *uniqueEquivs)

{
  Char *pCVar1;
  ulong uVar2;
  CharCount equivIndex;
  long lVar3;
  ulong uVar4;
  
  *uniqueEquivs = *equivs;
  uVar2 = 1;
  lVar3 = 1;
  do {
    if (lVar3 == 4) {
      return (CharCount)uVar2;
    }
    uVar4 = 0;
    do {
      if (uVar2 == uVar4) {
        uniqueEquivs[uVar2] = equivs[lVar3];
        uVar2 = (ulong)((CharCount)uVar2 + 1);
        break;
      }
      pCVar1 = uniqueEquivs + uVar4;
      uVar4 = uVar4 + 1;
    } while (*pCVar1 != equivs[lVar3]);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

CharCount MatchCharNode::FindUniqueEquivs(const Char equivs[CaseInsensitive::EquivClassSize], __out_ecount(4) Char uniqueEquivs[CaseInsensitive::EquivClassSize])
    {
        uniqueEquivs[0] = equivs[0];
        CharCount uniqueCount = 1;
        for (CharCount equivIndex = 1; equivIndex < CaseInsensitive::EquivClassSize; ++equivIndex)
        {
            bool alreadyHave = false;
            for (CharCount uniqueIndex = 0; uniqueIndex < uniqueCount; ++uniqueIndex)
            {
                if (uniqueEquivs[uniqueIndex] == equivs[equivIndex])
                {
                    alreadyHave = true;
                    break;
                }
            }

            if (!alreadyHave)
            {
                uniqueEquivs[uniqueCount] = equivs[equivIndex];
                uniqueCount += 1;
            }
        }

        return uniqueCount;
    }